

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O2

string * trimStars(string *__return_storage_ptr__,string *input)

{
  char cVar1;
  size_type __pos;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,input);
  __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (__return_storage_ptr__,'*',0);
  do {
    if (__pos == 0) {
LAB_00122962:
      if (((__pos < __return_storage_ptr__->_M_string_length - 1) &&
          (cVar1 = (__return_storage_ptr__->_M_dataplus)._M_p[__pos + 1], cVar1 != ' ')) &&
         (cVar1 != '*')) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  (__return_storage_ptr__,__pos + 1,1,' ');
      }
    }
    else {
      if (__pos == 0xffffffffffffffff) {
        return __return_storage_ptr__;
      }
      cVar1 = (__return_storage_ptr__->_M_dataplus)._M_p[__pos - 1];
      if ((cVar1 == ' ') || (cVar1 == '*')) goto LAB_00122962;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                (__return_storage_ptr__,__pos,1,' ');
      __pos = __pos + 1;
    }
    __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (__return_storage_ptr__,'*',__pos + 1);
  } while( true );
}

Assistant:

inline std::string trimStars( std::string const & input )
{
  std::string result = input;
  size_t      pos    = result.find( '*' );
  while ( pos != std::string::npos )
  {
    if ( ( 0 < pos ) && ( result[pos - 1] != ' ' ) && ( result[pos - 1] != '*' ) )
    {
      result.insert( pos, 1, ' ' );
      ++pos;
    }
    else if ( ( pos < result.length() - 1 ) && ( result[pos + 1] != ' ' ) && ( result[pos + 1] != '*' ) )
    {
      result.insert( pos + 1, 1, ' ' );
    }
    pos = result.find( '*', pos + 1 );
  }
  return result;
}